

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> *
split<4u>(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *__return_storage_ptr__,string *s,char sep)

{
  char *pcVar1;
  istream *piVar2;
  invalid_argument *this;
  out_of_range *poVar3;
  long lVar4;
  string tmp;
  istringstream iss;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  lVar4 = 0;
  do {
    *(char **)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar4) =
         __return_storage_ptr__->_M_elems[0].field_2._M_local_buf + lVar4;
    *(undefined8 *)((long)&__return_storage_ptr__->_M_elems[0]._M_string_length + lVar4) = 0;
    __return_storage_ptr__->_M_elems[0].field_2._M_local_buf[lVar4] = '\0';
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x80);
  if ((s->_M_string_length != 0) &&
     ((pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == sep || (pcVar1[s->_M_string_length - 1] == sep))))
  {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"strings starts or ends with separator");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)s,_S_in);
  lVar4 = 0;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,
                        (string *)
                        ((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar4),sep);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar3,"n");
      __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x80);
  local_1c0 = 0;
  local_1b8 = 0;
  local_1c8 = &local_1b8;
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_1a8,(string *)&local_1c8,sep);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
    }
    std::__cxx11::istringstream::~istringstream(local_1a8);
    std::ios_base::~ios_base(local_130);
    return __return_storage_ptr__;
  }
  poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar3,"n");
  __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::array<std::string, n> split(const std::string& s, const char sep)
{
  std::array<std::string, n> result;

  if (!s.empty())
  {
    if (s.front() == sep || s.back() == sep)
    {
      throw std::invalid_argument("strings starts or ends with separator");
    }
  }

  std::istringstream iss(s);
  for (uint32_t i = 0; i < n; ++i)
  {
    if (!std::getline(iss, result[i], sep))
    {
      throw std::out_of_range("n");
    }
  }

  std::string tmp;
  if (std::getline(iss, tmp, sep))
  {
    throw std::out_of_range("n");
  }

  return result;
}